

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::
FormatString<char[9],char_const*,char[32],char_const*,char[13],char_const*,char[89],char_const*,char[3]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [9],char **Args_1,
          char (*Args_2) [32],char **Args_3,char (*Args_4) [13],char **Args_5,char (*Args_6) [89],
          char **Args_7,char (*Args_8) [3])

{
  stringstream local_1d0 [8];
  stringstream ss;
  char (*Args_local_4) [13];
  char **Args_local_3;
  char (*Args_local_2) [32];
  char **Args_local_1;
  char (*Args_local) [9];
  
  std::__cxx11::stringstream::stringstream(local_1d0);
  FormatStrSS<std::__cxx11::stringstream,char[9],char_const*,char[32],char_const*,char[13],char_const*,char[89],char_const*,char[3]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
             (char (*) [9])this,(char **)Args,(char (*) [32])Args_1,(char **)Args_2,
             (char (*) [13])Args_3,(char **)Args_4,(char (*) [89])Args_5,(char **)Args_6,
             (char (*) [3])Args_7);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1d0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}